

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

void initCurrSymbolsEquiv(void)

{
  UBool UVar1;
  Hashtable *this;
  code *status_00;
  UErrorCode *status_01;
  Hashtable *local_38;
  Hashtable *temp;
  UErrorCode status;
  
  temp._4_4_ = U_ZERO_ERROR;
  status_00 = currency_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
  this = (Hashtable *)icu_63::UMemory::operator_new((UMemory *)0x58,(size_t)status_00);
  local_38 = (Hashtable *)0x0;
  if (this != (Hashtable *)0x0) {
    status_00 = (code *)((long)&temp + 4);
    icu_63::Hashtable::Hashtable(this,(UErrorCode *)status_00);
    local_38 = this;
  }
  if (local_38 != (Hashtable *)0x0) {
    UVar1 = U_FAILURE(temp._4_4_);
    if (UVar1 == '\0') {
      icu_63::Hashtable::setValueDeleter(local_38,deleteUnicode);
      status_01 = (UErrorCode *)((long)&temp + 4);
      populateCurrSymbolsEquiv(local_38,status_01);
      UVar1 = U_FAILURE(temp._4_4_);
      if (UVar1 == '\0') {
        gCurrSymbolsEquiv = local_38;
      }
      else if (local_38 != (Hashtable *)0x0) {
        icu_63::Hashtable::~Hashtable(local_38);
        icu_63::UMemory::operator_delete((UMemory *)local_38,status_01);
      }
    }
    else if (local_38 != (Hashtable *)0x0) {
      icu_63::Hashtable::~Hashtable(local_38);
      icu_63::UMemory::operator_delete((UMemory *)local_38,status_00);
    }
  }
  return;
}

Assistant:

static void U_CALLCONV initCurrSymbolsEquiv() {
    U_ASSERT(gCurrSymbolsEquiv == NULL);
    UErrorCode status = U_ZERO_ERROR;
    ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
    icu::Hashtable *temp = new icu::Hashtable(status);
    if (temp == NULL) {
        return;
    }
    if (U_FAILURE(status)) {
        delete temp;
        return;
    }
    temp->setValueDeleter(deleteUnicode);
    populateCurrSymbolsEquiv(temp, status);
    if (U_FAILURE(status)) {
        delete temp;
        return;
    }
    gCurrSymbolsEquiv = temp;
}